

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

int * Extra_GreyCodeSchedule(int n)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int *piVar8;
  
  iVar5 = 1 << ((byte)n & 0x1f);
  piVar2 = (int *)malloc((long)iVar5 << 2);
  if (n < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    iVar3 = 0;
    do {
      uVar7 = 1 << ((byte)iVar3 & 0x1f);
      piVar2[iVar4] = iVar3;
      iVar1 = iVar4 + 1;
      if (1 < (int)uVar7) {
        lVar6 = (ulong)uVar7 - 1;
        piVar8 = piVar2;
        do {
          piVar8[iVar4 + 1] = *piVar8;
          piVar8 = piVar8 + 1;
          lVar6 = lVar6 + -1;
          iVar1 = iVar4 + uVar7;
        } while (lVar6 != 0);
      }
      iVar4 = iVar1;
      iVar3 = iVar3 + 1;
    } while (iVar3 != n);
  }
  piVar2[iVar4] = n + -1;
  if (iVar4 + 1 != iVar5) {
    __assert_fail("b == (1<<n)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                  ,0x882,"int *Extra_GreyCodeSchedule(int)");
  }
  return piVar2;
}

Assistant:

int * Extra_GreyCodeSchedule( int n )
{
    int * pRes = ABC_ALLOC( int, (1<<n) );
    int i, k, b = 0;
//    pRes[b++] = -1;
    for ( k = 0; k < n; k++ )
        for ( pRes[b++] = k, i = 1; i < (1<<k); i++ )
            pRes[b++] = pRes[i-1]; // pRes[i];
    pRes[b++] = n-1;
    assert( b == (1<<n) );

    if ( 0 )
    {
        unsigned uSign = 0;
        for ( b = 0; b < (1<<n); b++ )
        {
            uSign ^= (1 << pRes[b]);
            printf( "%3d %3d  ", b, pRes[b] );
            Extra_PrintBinary( stdout, &uSign, n );
            printf( "\n" );
        }
    }
    return pRes;
}